

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::ReadBaseMaterials(XmlSerializer *this)

{
  _Rb_tree_header *p_Var1;
  pointer *pppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  iterator __position;
  int iVar5;
  _Rb_tree_color _Var6;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  mapped_type *this_01;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr *__x;
  bool bVar9;
  uint id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MatIdArray;
  aiMaterial *local_48;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  iVar5 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                    (this->xmlReader,XmlTag::basematerials_id_abi_cxx11_);
  if ((char *)CONCAT44(extraout_var,iVar5) == (char *)0x0) goto LAB_00679b3e;
  _Var6 = atoi((char *)CONCAT44(extraout_var,iVar5));
  local_48 = (aiMaterial *)CONCAT44(local_48._4_4_,_Var6);
  ppaVar3 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppaVar4 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (_Var6 != this->mActiveMatGroup) {
    this->mActiveMatGroup = _Var6;
    p_Var7 = (this->mMatId2MatArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 == (_Base_ptr)0x0) {
LAB_00679adc:
      this_00 = std::
                map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[](&this->mMatId2MatArray,(key_type *)&local_48);
      __x = (_Base_ptr *)&local_38;
    }
    else {
      p_Var1 = &(this->mMatId2MatArray)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      do {
        bVar9 = p_Var7[1]._M_color < _Var6;
        if (!bVar9) {
          p_Var8 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar9];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 == p_Var1) || (_Var6 < p_Var8[1]._M_color)) goto LAB_00679adc;
      __x = &p_Var8[1]._M_parent;
      this_00 = &local_38;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
  }
  local_3c = (uint)((ulong)((long)ppaVar3 - (long)ppaVar4) >> 3);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_38,
               (iterator)
               local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_3c);
  }
  else {
    *local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_3c;
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  this_01 = std::
            map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->mMatId2MatArray,&this->mActiveMatGroup);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_01,&local_38);
LAB_00679b3e:
  while( true ) {
    bVar9 = ReadToEndElement(this,(string *)&XmlTag::basematerials_abi_cxx11_);
    if (!bVar9) break;
    local_48 = readMaterialDef(this);
    __position._M_current =
         (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&this->mMatArray,__position,
                 &local_48);
    }
    else {
      *__position._M_current = local_48;
      pppaVar2 = &(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar2 = *pppaVar2 + 1;
    }
  }
  if ((_Base_ptr)
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReadBaseMaterials() {
        std::vector<unsigned int> MatIdArray;
        const char *baseMaterialId( xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_id.c_str() ) );
        if ( nullptr != baseMaterialId ) {
            unsigned int id = std::atoi( baseMaterialId );
            const size_t newMatIdx( mMatArray.size() );
            if ( id != mActiveMatGroup ) {
                mActiveMatGroup = id;
                MatId2MatArray::const_iterator it( mMatId2MatArray.find( id ) );
                if ( mMatId2MatArray.end() == it ) {
                    MatIdArray.clear();
                    mMatId2MatArray[ id ] = MatIdArray;
                } else {
                    MatIdArray = it->second;
                }
            }
            MatIdArray.push_back( static_cast<unsigned int>( newMatIdx ) );
            mMatId2MatArray[ mActiveMatGroup ] = MatIdArray;
        }

        while ( ReadToEndElement( D3MF::XmlTag::basematerials ) ) {
            mMatArray.push_back( readMaterialDef() );
        }
    }